

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

long __thiscall Vector::extractMin(Vector *this,VectorDouble *values)

{
  long *plVar1;
  long lVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar6 = this->vLength;
  if (uVar6 == 0) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    dVar8 = 1.79769313486232e+308;
    uVar5 = 0xffffffffffffffff;
    uVar7 = 0;
    do {
      dVar3 = values->vData[this->vData[uVar7]];
      uVar4 = uVar7;
      if (dVar8 <= values->vData[this->vData[uVar7]]) {
        dVar3 = dVar8;
        uVar4 = uVar5;
      }
      uVar5 = uVar4;
      dVar8 = dVar3;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (-1 < (long)uVar5) {
    plVar1 = this->vData;
    lVar2 = plVar1[uVar5];
    if (uVar5 < uVar6) {
      while (uVar7 = uVar5 + 1, uVar7 < uVar6) {
        plVar1[uVar5] = plVar1[uVar7];
        uVar5 = uVar7;
        uVar6 = this->vLength;
      }
      this->vLength = uVar6 - 1;
    }
    uVar5 = (ulong)(double)lVar2;
  }
  return uVar5;
}

Assistant:

long Vector::extractMin(VectorDouble &values) {
  double current_min = DBL_MAX;
  long best_index = -1;

  for (unsigned long i = 0; i < vLength; i++) {
    double try_value = values.value(vData[i]);
    if (try_value < current_min) {
      best_index = i;
      current_min = try_value;
    }
  }

  if (best_index >= 0) {
    current_min = vData[best_index];
    remove(best_index);
    return current_min;
  }

  return best_index;
}